

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx,RSA *rsa)

{
  int iVar1;
  UniquePtr<EVP_PKEY> pkey;
  
  if (rsa != (RSA *)0x0) {
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)EVP_PKEY_new();
    if (((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) ||
       (iVar1 = EVP_PKEY_set1_RSA((EVP_PKEY *)
                                  pkey._M_t.
                                  super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,rsa),
       iVar1 == 0)) {
      iVar1 = 0;
      ERR_put_error(0x10,0,6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x182);
    }
    else {
      iVar1 = SSL_CTX_use_PrivateKey
                        (ctx,(EVP_PKEY *)
                             pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pkey);
    return iVar1;
  }
  ERR_put_error(0x10,0,0x43,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                ,0x17c);
  return 0;
}

Assistant:

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx, RSA *rsa) {
  if (rsa == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (!pkey || !EVP_PKEY_set1_RSA(pkey.get(), rsa)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_EVP_LIB);
    return 0;
  }

  return SSL_CTX_use_PrivateKey(ctx, pkey.get());
}